

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall randomx::Instruction::h_CBRANCH(Instruction *this,ostream *os)

{
  byte bVar1;
  ostream *poVar2;
  long *plVar3;
  
  bVar1 = this->dst;
  std::__ostream_insert<char,std::char_traits<char>>(os,"r",1);
  poVar2 = (ostream *)std::ostream::operator<<(os,bVar1 & 7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->imm32);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", COND ",7);
  plVar3 = (long *)std::ostream::operator<<(poVar2,(uint)(this->mod >> 4));
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void Instruction::h_CBRANCH(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		os << "r" << dstIndex << ", " << (int32_t)getImm32() << ", COND " << (int)(getModCond()) << std::endl;
	}